

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

int __thiscall Console::step(Console *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = CPU::execute(this->cpu);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    iVar2 = 1;
    if (1 < iVar1 * 3) {
      iVar2 = iVar1 * 3;
    }
    do {
      iVar1 = PPU::execute(this->ppu);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return iVar1;
}

Assistant:

int Console::step() {
    int frame = 0;
    int cpu_cycles = cpu->execute();
    for (int i = 0; i < (3*cpu_cycles); ++i) {
    	frame = ppu->execute();
    }
    return frame;
}